

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meld.cpp
# Opt level: O0

bool __thiscall mahjong::Meld::isSimples(Meld *this)

{
  bool bVar1;
  const_reference pvVar2;
  bool local_13;
  IsSimple local_12;
  IsSimple local_11;
  Meld *local_10;
  Meld *this_local;
  
  local_10 = this;
  pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::front(&this->tiles);
  bVar1 = IsSimple::operator()(&local_11,pvVar2);
  local_13 = false;
  if (bVar1) {
    pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::back(&this->tiles);
    local_13 = IsSimple::operator()(&local_12,pvVar2);
  }
  return local_13;
}

Assistant:

bool Meld::isSimples() const
{
	return IsSimple()(tiles.front()) && IsSimple()(tiles.back());
}